

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t check_authentication_code(archive_read *a,void *_p)

{
  void *pvVar1;
  int iVar2;
  size_t sStack_50;
  wchar_t cmp;
  size_t hmac_len;
  uint8_t hmac [20];
  void *p;
  zip *zip;
  void *_p_local;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  if (*(char *)((long)pvVar1 + 0x1f0) != '\0') {
    sStack_50 = 0x14;
    __hmac_sha1_final((archive_hmac_sha1_ctx *)((long)pvVar1 + 0x1e8),(uint8_t *)&hmac_len,
                      &stack0xffffffffffffffb0);
    unique0x100000cf = _p;
    if ((_p == (void *)0x0) &&
       (register0x00000000 = __archive_read_ahead(a,10,(ssize_t *)0x0),
       register0x00000000 == (void *)0x0)) {
      archive_set_error(&a->archive,0x54,"Truncated ZIP file data");
      return L'\xffffffe2';
    }
    iVar2 = memcmp(&hmac_len,stack0xffffffffffffffd0,10);
    __archive_read_consume(a,10);
    if (iVar2 != 0) {
      archive_set_error(&a->archive,-1,"ZIP bad Authentication code");
      return L'\xffffffec';
    }
  }
  return L'\0';
}

Assistant:

static int
check_authentication_code(struct archive_read *a, const void *_p)
{
	struct zip *zip = (struct zip *)(a->format->data);

	/* Check authentication code. */
	if (zip->hctx_valid) {
		const void *p;
		uint8_t hmac[20];
		size_t hmac_len = 20;
		int cmp;

		archive_hmac_sha1_final(&zip->hctx, hmac, &hmac_len);
		if (_p == NULL) {
			/* Read authentication code. */
			p = __archive_read_ahead(a, AUTH_CODE_SIZE, NULL);
			if (p == NULL) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Truncated ZIP file data");
				return (ARCHIVE_FATAL);
			}
		} else {
			p = _p;
		}
		cmp = memcmp(hmac, p, AUTH_CODE_SIZE);
		__archive_read_consume(a, AUTH_CODE_SIZE);
		if (cmp != 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "ZIP bad Authentication code");
			return (ARCHIVE_WARN);
		}
	}
	return (ARCHIVE_OK);
}